

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS
ref_geom_edg_t_bounding_sphere2(REF_GEOM ref_geom,REF_INT *nodes,REF_DBL *center,REF_DBL *radius)

{
  uint uVar1;
  double local_90;
  double local_88;
  double local_80;
  double local_70;
  double local_68;
  double local_60;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT sens;
  REF_DBL t1;
  REF_DBL t0;
  REF_DBL *radius_local;
  REF_DBL *center_local;
  REF_INT *nodes_local;
  REF_GEOM ref_geom_local;
  
  t0 = (REF_DBL)radius;
  radius_local = center;
  center_local = (REF_DBL *)nodes;
  nodes_local = &ref_geom->n;
  uVar1 = ref_geom_cell_tuv(ref_geom,*nodes,nodes,1,&t1,&ref_private_macro_code_rss_1);
  if (uVar1 == 0) {
    ref_geom_local._4_4_ =
         ref_geom_cell_tuv((REF_GEOM)nodes_local,*(REF_INT *)((long)center_local + 4),
                           (REF_INT *)center_local,1,(REF_DBL *)&ref_private_macro_code_rss,
                           &ref_private_macro_code_rss_1);
    if (ref_geom_local._4_4_ == 0) {
      *radius_local = (t1 + _ref_private_macro_code_rss) * 0.5;
      *(undefined8 *)t0 = 0;
      if (t1 - *radius_local <= 0.0) {
        local_60 = -(t1 - *radius_local);
      }
      else {
        local_60 = t1 - *radius_local;
      }
      if (*(double *)t0 <= local_60) {
        if (t1 - *radius_local <= 0.0) {
          local_70 = -(t1 - *radius_local);
        }
        else {
          local_70 = t1 - *radius_local;
        }
        local_68 = local_70;
      }
      else {
        local_68 = *(double *)t0;
      }
      *(double *)t0 = local_68;
      if (_ref_private_macro_code_rss - *radius_local <= 0.0) {
        local_80 = -(_ref_private_macro_code_rss - *radius_local);
      }
      else {
        local_80 = _ref_private_macro_code_rss - *radius_local;
      }
      if (*(double *)t0 <= local_80) {
        if (_ref_private_macro_code_rss - *radius_local <= 0.0) {
          local_90 = -(_ref_private_macro_code_rss - *radius_local);
        }
        else {
          local_90 = _ref_private_macro_code_rss - *radius_local;
        }
        local_88 = local_90;
      }
      else {
        local_88 = *(double *)t0;
      }
      *(double *)t0 = local_88;
      ref_geom_local._4_4_ = 0;
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xf9b,
             "ref_geom_edg_t_bounding_sphere2",(ulong)ref_geom_local._4_4_,"uv1");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xf99,
           "ref_geom_edg_t_bounding_sphere2",(ulong)uVar1,"uv0");
    ref_geom_local._4_4_ = uVar1;
  }
  return ref_geom_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_geom_edg_t_bounding_sphere2(REF_GEOM ref_geom,
                                                   REF_INT *nodes,
                                                   REF_DBL *center,
                                                   REF_DBL *radius) {
  REF_DBL t0, t1;
  REF_INT sens;

  RSS(ref_geom_cell_tuv(ref_geom, nodes[0], nodes, REF_GEOM_EDGE, &t0, &sens),
      "uv0");
  RSS(ref_geom_cell_tuv(ref_geom, nodes[1], nodes, REF_GEOM_EDGE, &t1, &sens),
      "uv1");

  *center = (t0 + t1) * 0.5;

  *radius = 0.0;
  *radius = MAX(*radius, ABS(t0 - (*center)));
  *radius = MAX(*radius, ABS(t1 - (*center)));

  return REF_SUCCESS;
}